

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_setStringOptionValue(void *highs,char *option,char *value)

{
  HighsStatus HVar1;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,option,&local_51);
  std::__cxx11::string::string((string *)&local_50,value,&local_52);
  HVar1 = Highs::setOptionValue((Highs *)highs,&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_setStringOptionValue(void* highs, const char* option,
                                    const char* value) {
  return (HighsInt)((Highs*)highs)
      ->setOptionValue(std::string(option), std::string(value));
}